

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool checkInterfacePropertyCompatibility<bool>
               (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
               bool *param_6)

{
  cmLocalGenerator *localGenerator;
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  cmPropertyMap *pcVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar12;
  string *psVar13;
  cmGeneratorExpressionInterpreter *this;
  ostream *poVar14;
  string *psVar15;
  size_t sVar16;
  pointer ppcVar17;
  uint uVar18;
  bool bVar19;
  string reportEntry;
  string report;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  ostringstream e;
  string interfaceProperty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string local_2e0;
  cmGeneratorExpressionInterpreter *local_2c0;
  string *local_2b8;
  cmGeneratorTarget *local_2b0;
  string local_2a8;
  string local_288;
  _Base_ptr local_268;
  _Base_ptr local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  string local_248;
  char *local_228;
  pointer local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string local_200 [3];
  ios_base local_190 [264];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_228 = defaultValue;
  bVar7 = cmTarget::GetPropertyAsBool(tgt->Target,p);
  uVar9 = (uint)bVar7;
  pcVar10 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_48,pcVar10);
  _Var11 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar19 = _Var11._M_current !=
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_260 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_258 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_268 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_250 = _Var11._M_current;
  if (local_260 != local_268 &&
      _Var11._M_current !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = bool]"
                 );
  }
  pvVar12 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar12->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar12->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288," * Target \"","");
    psVar13 = cmTarget::GetName_abi_cxx11_(tgt->Target);
    std::__cxx11::string::_M_append((char *)&local_288,(ulong)(psVar13->_M_dataplus)._M_p);
    local_2b0 = tgt;
    if (local_250 != local_258) {
      std::__cxx11::string::append((char *)&local_288);
      iVar8 = 0x5a06e3;
      if (bVar7) {
        iVar8 = 0x59cc29;
      }
      local_200[0]._M_dataplus._M_p = (pointer)&local_200[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,iVar8,(uVar9 ^ 5) + iVar8)
      ;
      std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_200[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
        operator_delete(local_200[0]._M_dataplus._M_p,local_200[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    pcVar2 = local_2b0;
    std::__cxx11::string::append((char *)&local_288);
    std::operator+(&local_68,"INTERFACE_",p);
    iVar8 = std::__cxx11::string::compare((char *)p);
    local_2b8 = p;
    if (iVar8 == 0) {
      this = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = pcVar2->LocalGenerator;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar1,pcVar1 + config->_M_string_length);
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this,localGenerator,&local_248,pcVar2,&local_88);
      p = local_2b8;
      local_2c0 = this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_2c0 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    ppcVar17 = (pvVar12->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_220 = (pvVar12->
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = uVar9;
    if (ppcVar17 != local_220) {
      do {
        pcVar2 = *ppcVar17;
        pcVar10 = cmTarget::GetProperties(pcVar2->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_218,pcVar10);
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (local_218.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_218.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        pbVar6 = local_218.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar7 = getTypedProperty<bool>(pcVar2,&local_68,local_2c0);
        uVar9 = (uint)bVar7;
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        local_2e0._M_string_length = 0;
        local_2e0.field_2._M_local_buf[0] = '\0';
        if (_Var11._M_current == pbVar6) {
          uVar9 = uVar18;
          if (local_260 != local_268) {
            uVar9 = 0;
          }
          if (local_250 != local_258) {
            uVar9 = uVar18;
          }
          iVar8 = 3;
        }
        else {
          std::__cxx11::string::append((char *)&local_2e0);
          pbVar4 = local_250;
          pbVar3 = local_258;
          psVar13 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)(psVar13->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_2e0);
          iVar8 = 0x5a06e3;
          if (bVar7) {
            iVar8 = 0x59cc29;
          }
          local_200[0]._M_dataplus._M_p = (pointer)&local_200[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,iVar8,(uVar9 ^ 5) + iVar8);
          std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_200[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
            operator_delete(local_200[0]._M_dataplus._M_p,
                            local_200[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_2e0);
          if (pbVar4 == pbVar3) {
            if (local_260 == local_268) {
              if (bVar19) {
                std::__cxx11::string::_M_append
                          ((char *)&local_288,(ulong)local_2e0._M_dataplus._M_p);
                compatibilityAgree_abi_cxx11_(local_200,t,false);
                std::__cxx11::string::_M_append
                          ((char *)&local_288,(ulong)local_200[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
                  operator_delete(local_200[0]._M_dataplus._M_p,
                                  local_200[0].field_2._M_allocated_capacity + 1);
                }
                iVar8 = 3;
                bVar19 = true;
                uVar9 = uVar18;
                if (bVar7 != SUB41(uVar18,0)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,"The INTERFACE_",0xe);
                  psVar13 = local_2b8;
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,(local_2b8->_M_dataplus)._M_p,
                                       local_2b8->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14," property of \"",0xe);
                  psVar15 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,"\" does\nnot agree with the value of ",0x23);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," already determined\nfor \"",0x19);
                  psVar13 = cmTarget::GetName_abi_cxx11_(local_2b0->Target);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\".\n",3);
                  std::__cxx11::stringbuf::str();
                  cmSystemTools::Error(&local_2a8);
                  goto LAB_003b58f1;
                }
              }
              else {
                local_200[0]._M_dataplus._M_p = (pointer)&local_200[0].field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_200,local_2e0._M_dataplus._M_p,
                           local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
                std::__cxx11::string::append((char *)local_200);
                std::__cxx11::string::_M_append
                          ((char *)&local_288,(ulong)local_200[0]._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
                  operator_delete(local_200[0]._M_dataplus._M_p,
                                  local_200[0].field_2._M_allocated_capacity + 1);
                }
                iVar8 = 0;
                bVar19 = true;
              }
            }
            else {
              std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2e0._M_dataplus._M_p);
              compatibilityAgree_abi_cxx11_(local_200,t,false);
              std::__cxx11::string::_M_append
                        ((char *)&local_288,(ulong)local_200[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
                operator_delete(local_200[0]._M_dataplus._M_p,
                                local_200[0].field_2._M_allocated_capacity + 1);
              }
              if (bVar7) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                psVar13 = local_2b8;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"Property ",9);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,(psVar13->_M_dataplus)._M_p,
                                     psVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," on target \"",0xc);
                psVar15 = cmTarget::GetName_abi_cxx11_(local_2b0->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\" is\nimplied to be ",0x13);
                pcVar5 = local_228;
                if (local_228 == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)poVar14->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar16 = strlen(local_228);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar5,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," property on\ndependency \"",0x19);
                psVar13 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_2a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p,
                                  local_2a8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                std::ios_base::~ios_base(local_190);
                iVar8 = 2;
              }
              else {
                iVar8 = 3;
              }
              uVar9 = 0;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2e0._M_dataplus._M_p);
            compatibilityAgree_abi_cxx11_(local_200,t,false);
            std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_200[0]._M_dataplus._M_p)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
              operator_delete(local_200[0]._M_dataplus._M_p,
                              local_200[0].field_2._M_allocated_capacity + 1);
            }
            iVar8 = 3;
            uVar9 = uVar18;
            if (bVar7 != SUB41(uVar18,0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"Property ",9)
              ;
              psVar13 = local_2b8;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_200,(local_2b8->_M_dataplus)._M_p,
                                   local_2b8->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," on target \"",0xc);
              psVar15 = cmTarget::GetName_abi_cxx11_(local_2b0->Target);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"\" does\nnot match the INTERFACE_",0x1f);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," property requirement\nof dependency \"",0x25);
              psVar13 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(psVar13->_M_dataplus)._M_p,psVar13->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_2a8);
LAB_003b58f1:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
              std::ios_base::~ios_base(local_190);
              iVar8 = 2;
              uVar9 = uVar18;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                   local_2e0.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_218);
        p = local_2b8;
      } while (((iVar8 == 3) || (iVar8 == 0)) &&
              (ppcVar17 = ppcVar17 + 1, uVar18 = uVar9, ppcVar17 != local_220));
    }
    iVar8 = 0x5a06e3;
    bVar7 = SUB41(uVar9,0);
    if (uVar9 != 0) {
      iVar8 = 0x59cc29;
    }
    local_200[0]._M_dataplus._M_p = (pointer)&local_200[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,iVar8,(uVar9 ^ 5) + iVar8);
    compatibilityType_abi_cxx11_(&local_2e0,t);
    cmGeneratorTarget::ReportPropertyOrigin(local_2b0,p,local_200,&local_288,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                               local_2e0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200[0]._M_dataplus._M_p != &local_200[0].field_2) {
      operator_delete(local_200[0]._M_dataplus._M_p,local_200[0].field_2._M_allocated_capacity + 1);
    }
    if (local_2c0 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_2c0,local_2c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar7;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}